

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_sign(int type,uchar *dgst,int dlen,uchar *sig,uint *siglen,DSA *dsa)

{
  uint uVar1;
  DSA_SIG *a;
  undefined4 in_register_00000014;
  DSA_SIG *s;
  DSA *dsa_local;
  uint *out_siglen_local;
  uint8_t *out_sig_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  int type_local;
  
  out_sig_local = (uint8_t *)CONCAT44(in_register_00000014,dlen);
  out_siglen_local = (uint *)sig;
  digest_len_local = (size_t)dgst;
  digest_local._0_4_ = type;
  a = DSA_do_sign(dgst,dlen,dsa);
  if (a != (DSA_SIG *)0x0) {
    uVar1 = i2d_DSA_SIG(a,(uchar **)&out_siglen_local);
    *siglen = uVar1;
    DSA_SIG_free(a);
  }
  else {
    *siglen = 0;
  }
  digest_local._4_4_ = (uint)(a != (DSA_SIG *)0x0);
  return digest_local._4_4_;
}

Assistant:

int DSA_sign(int type, const uint8_t *digest, size_t digest_len,
             uint8_t *out_sig, unsigned int *out_siglen, const DSA *dsa) {
  DSA_SIG *s;

  s = DSA_do_sign(digest, digest_len, dsa);
  if (s == NULL) {
    *out_siglen = 0;
    return 0;
  }

  *out_siglen = i2d_DSA_SIG(s, &out_sig);
  DSA_SIG_free(s);
  return 1;
}